

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

void lj_meta_istype(lua_State *L,BCReg ra,BCReg tp)

{
  GCstr *pGVar1;
  cTValue *o;
  int narg;
  
  L->top = L->base + *(byte *)(*(long *)((L->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  narg = ra + 1;
  if (tp != 5) {
    if (tp != 0xf) {
      lj_err_argtype(L,narg,lj_obj_itypename[tp - 1]);
    }
    lj_lib_checknum(L,narg);
    return;
  }
  o = L->base + (long)narg + -1;
  if (L->top <= o) {
LAB_0015250e:
    lj_err_argt(L,narg,4);
  }
  if (o->it64 >> 0x2f != 0xfffffffffffffffb) {
    if (0xfffffffffffffff2 < (ulong)(o->it64 >> 0x2f)) goto LAB_0015250e;
    pGVar1 = lj_strfmt_number(L,o);
    o->u64 = (ulong)pGVar1 | 0xfffd800000000000;
  }
  return;
}

Assistant:

void lj_meta_istype(lua_State *L, BCReg ra, BCReg tp)
{
  L->top = curr_topL(L);
  ra++; tp--;
  lj_assertL(LJ_DUALNUM || tp != ~LJ_TNUMX, "bad type for ISTYPE");
  if (LJ_DUALNUM && tp == ~LJ_TNUMX) lj_lib_checkint(L, ra);
  else if (tp == ~LJ_TNUMX+1) lj_lib_checknum(L, ra);
  else if (tp == ~LJ_TSTR) lj_lib_checkstr(L, ra);
  else lj_err_argtype(L, ra, lj_obj_itypename[tp]);
}